

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewDocNodeEatName(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  int iVar1;
  xmlNodePtr pxVar2;
  xmlNodePtr pxVar3;
  _xmlNode *local_38;
  xmlNodePtr ulccur;
  xmlNodePtr cur;
  xmlChar *content_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlDocPtr doc_local;
  
  pxVar2 = xmlNewNodeEatName(ns,name);
  if (pxVar2 == (xmlNodePtr)0x0) {
    if (((name != (xmlChar *)0x0) && (doc != (xmlDocPtr)0x0)) &&
       (iVar1 = xmlDictOwns(doc->dict,name), iVar1 == 0)) {
      (*xmlFree)(name);
    }
  }
  else {
    pxVar2->doc = doc;
    if (content != (xmlChar *)0x0) {
      pxVar3 = xmlStringGetNodeList(doc,content);
      pxVar2->children = pxVar3;
      if (pxVar2 != (xmlNodePtr)0x0) {
        local_38 = pxVar2->children;
        if (local_38 == (_xmlNode *)0x0) {
          pxVar2->last = (_xmlNode *)0x0;
        }
        else {
          for (; local_38->next != (_xmlNode *)0x0; local_38 = local_38->next) {
            local_38->parent = pxVar2;
          }
          local_38->parent = pxVar2;
          pxVar2->last = local_38;
        }
      }
    }
  }
  return pxVar2;
}

Assistant:

xmlNodePtr
xmlNewDocNodeEatName(xmlDocPtr doc, xmlNsPtr ns,
              xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    cur = xmlNewNodeEatName(ns, name);
    if (cur != NULL) {
        cur->doc = doc;
	if (content != NULL) {
	    cur->children = xmlStringGetNodeList(doc, content);
	    UPDATE_LAST_CHILD_AND_PARENT(cur)
	}
    } else {
        /* if name don't come from the doc dictionary free it here */
        if ((name != NULL) && (doc != NULL) &&
	    (!(xmlDictOwns(doc->dict, name))))
	    xmlFree(name);
    }
    return(cur);
}